

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O3

void __thiscall HighsSplitDeque::growShared(HighsSplitDeque *this)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint uVar3;
  
  if ((((this->ownerData).workerBunk.
        super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      haveJobs).super___atomic_base<int>._M_i == (this->ownerData).numWorkers) {
    if (((this->splitRequest)._M_base._M_i & 1U) != 0) {
      uVar2 = (this->ownerData).head;
      uVar3 = 0x2000;
      if (uVar2 < 0x2000) {
        uVar3 = uVar2;
      }
      LOCK();
      paVar1 = &(this->stealerData).ts;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i ^
           (ulong)((this->ownerData).splitCopy ^ uVar3);
      UNLOCK();
      (this->ownerData).splitCopy = uVar3;
      (this->splitRequest)._M_base._M_i = false;
    }
    return;
  }
  uVar2 = (this->ownerData).head;
  uVar3 = 0x2000;
  if (uVar2 < 0x2000) {
    uVar3 = uVar2;
  }
  LOCK();
  paVar1 = &(this->stealerData).ts;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i ^
       (ulong)((this->ownerData).splitCopy ^ uVar3);
  UNLOCK();
  (this->ownerData).splitCopy = uVar3;
  WorkerBunk::publishWork
            ((this->ownerData).workerBunk.
             super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this
            );
  return;
}

Assistant:

void growShared() {
    int haveJobs =
        ownerData.workerBunk->haveJobs.load(std::memory_order_relaxed);
    bool splitRq = false;
    uint32_t newSplit;
    if (haveJobs == ownerData.numWorkers) {
      splitRq = splitRequest.load(std::memory_order_relaxed);
      if (!splitRq) return;
    }

    newSplit = std::min(uint32_t{kTaskArraySize}, ownerData.head);

    assert(newSplit > ownerData.splitCopy);

    // we want to replace the old split point with the new splitPoint
    // but not alter the upper 32 bits of tail.
    // Hence with xor we can xor or the copy of the current split point
    // to set the lower bits to zero and then xor the bits of the new split
    // point to the lower bits that are then zero. First doing the xor of the
    // old and new split point and then doing the xor with the stealerData
    // will not alter the result. Also the upper 32 bits of the xor mask are
    // zero and will therefore not alter the value of tail.
    uint64_t xorMask = ownerData.splitCopy ^ newSplit;
    // since we publish the task data here, we need to use
    // std::memory_order_release which ensures all writes to set up the task
    // are done
    assert((xorMask >> 32) == 0);

    stealerData.ts.fetch_xor(xorMask, std::memory_order_release);
    ownerData.splitCopy = newSplit;
    if (splitRq)
      splitRequest.store(false, std::memory_order_relaxed);
    else
      ownerData.workerBunk->publishWork(this);
  }